

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int isBootRecord(iso9660 *iso9660,uchar *h)

{
  uchar *h_local;
  iso9660 *iso9660_local;
  
  if (*h == '\0') {
    if (h[6] == '\x01') {
      iso9660_local._4_4_ = 1;
    }
    else {
      iso9660_local._4_4_ = 0;
    }
  }
  else {
    iso9660_local._4_4_ = 0;
  }
  return iso9660_local._4_4_;
}

Assistant:

static int
isBootRecord(struct iso9660 *iso9660, const unsigned char *h)
{
	(void)iso9660; /* UNUSED */

	/* Type of the Volume Descriptor Boot Record must be 0. */
	if (h[0] != 0)
		return (0);

	/* Volume Descriptor Version must be 1. */
	if (h[6] != 1)
		return (0);

	return (1);
}